

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::CatalogSet::RenameEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *old,string *new_name,
          AlterInfo *alter_info,unique_lock<std::mutex> *read_lock)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var2;
  ulong uVar3;
  pointer pcVar4;
  DuckCatalog *catalog;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  optional_ptr<duckdb::ClientContext,_true> oVar5;
  transaction_t tVar6;
  transaction_t tVar7;
  bool bVar8;
  int iVar9;
  reference<CatalogEntry> entry;
  iterator iVar10;
  optional_ptr<duckdb::CatalogEntry,_true> oVar11;
  CatalogException *this_00;
  undefined4 extraout_var;
  InCatalogEntry *pIVar12;
  pointer pIVar13;
  templated_unique_single_t renamed_node;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_d8;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_d0;
  string *local_c8;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_c0;
  string local_b8;
  unique_lock<std::mutex> *local_98;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_90;
  optional_ptr<duckdb::CatalogEntry,_true> local_88;
  ClientContext *local_80;
  AlterInfo *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = read_lock;
  optional_ptr<duckdb::ClientContext,_true>::CheckValid(&transaction.context);
  oVar5 = transaction.context;
  local_c8 = new_name;
  iVar10 = ::std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                   *)&this->map,new_name);
  tVar7 = transaction.start_time;
  tVar6 = transaction.transaction_id;
  if ((_Rb_tree_header *)iVar10._M_node == &(this->map).entries._M_t._M_impl.super__Rb_tree_header)
  {
    local_88.ptr = (type)0x0;
  }
  else {
    local_80 = oVar5.ptr;
    local_88.ptr = *(CatalogEntry **)(iVar10._M_node + 2);
    local_78 = alter_info;
    if (local_88.ptr != (type)0x0) {
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_88);
      _Var2._M_head_impl =
           ((local_88.ptr)->child).
           super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
           super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
           .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
      oVar11.ptr = local_88.ptr;
      while (_Var2._M_head_impl != (CatalogEntry *)0x0) {
        uVar3 = ((oVar11.ptr)->timestamp).super___atomic_base<unsigned_long>._M_i;
        if ((tVar6 == uVar3) || (uVar3 < tVar7)) break;
        oVar11.ptr = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                     ::operator*(&(oVar11.ptr)->child);
        _Var2._M_head_impl =
             ((oVar11.ptr)->child).
             super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
             .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
      }
      if ((oVar11.ptr)->deleted == false) {
        (*old->_vptr_CatalogEntry[4])(old,local_80,local_78);
        this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "Could not rename \"%s\" to \"%s\": another entry with this name already exists!"
                   ,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar4 = (old->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + (old->name)._M_string_length);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar4 = (local_c8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + local_c8->_M_string_length);
        CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                  (this_00,&local_b8,&local_50,&local_70);
        __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  iVar9 = (*old->_vptr_CatalogEntry[0xb])(old);
  pIVar12 = (InCatalogEntry *)operator_new(0xe0);
  paVar1 = &local_b8.field_2;
  pcVar4 = (old->name)._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar4,pcVar4 + (old->name)._M_string_length);
  InCatalogEntry::InCatalogEntry
            (pIVar12,RENAMED_ENTRY,(Catalog *)CONCAT44(extraout_var,iVar9),&local_b8);
  local_d0._M_head_impl = pIVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  tVar6 = transaction.transaction_id;
  pIVar13 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
            operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                        *)&local_d0);
  LOCK();
  (pIVar13->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = tVar6;
  UNLOCK();
  pIVar13 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
            operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                        *)&local_d0);
  (pIVar13->super_CatalogEntry).deleted = false;
  pIVar13 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
            operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                        *)&local_d0);
  local_c0._M_head_impl = local_d0._M_head_impl;
  (pIVar13->super_CatalogEntry).set.ptr = this;
  local_d0._M_head_impl = (InCatalogEntry *)0x0;
  transaction_00.context.ptr = transaction.context.ptr;
  transaction_00.db.ptr = transaction.db.ptr;
  transaction_00.transaction.ptr = transaction.transaction.ptr;
  transaction_00.transaction_id = transaction.transaction_id;
  transaction_00.start_time = transaction.start_time;
  bVar8 = CreateEntryInternal(this,transaction_00,&old->name,
                              (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                               *)&local_c0,local_98,false);
  if (local_c0._M_head_impl != (InCatalogEntry *)0x0) {
    (*((local_c0._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
  }
  local_c0._M_head_impl = (InCatalogEntry *)0x0;
  if ((bVar8) &&
     (transaction_01.context.ptr = transaction.context.ptr,
     transaction_01.db.ptr = transaction.db.ptr,
     transaction_01.transaction.ptr = transaction.transaction.ptr,
     transaction_01.transaction_id = transaction.transaction_id,
     transaction_01.start_time = transaction.start_time,
     bVar8 = DropEntryInternal(this,transaction_01,&old->name,false), bVar8)) {
    catalog = this->catalog;
    pIVar12 = (InCatalogEntry *)operator_new(0xe0);
    pcVar4 = (local_c8->_M_dataplus)._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar4,pcVar4 + local_c8->_M_string_length);
    InCatalogEntry::InCatalogEntry(pIVar12,RENAMED_ENTRY,&catalog->super_Catalog,&local_b8);
    local_d8._M_head_impl = pIVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    tVar6 = transaction.transaction_id;
    pIVar13 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
              ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                            *)&local_d8);
    LOCK();
    (pIVar13->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = tVar6;
    UNLOCK();
    pIVar13 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
              ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                            *)&local_d8);
    (pIVar13->super_CatalogEntry).deleted = false;
    pIVar13 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
              ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                            *)&local_d8);
    local_90._M_head_impl = local_d8._M_head_impl;
    (pIVar13->super_CatalogEntry).set.ptr = this;
    local_d8._M_head_impl = (InCatalogEntry *)0x0;
    transaction_02.context.ptr = transaction.context.ptr;
    transaction_02.db.ptr = transaction.db.ptr;
    transaction_02.transaction.ptr = transaction.transaction.ptr;
    transaction_02.transaction_id = transaction.transaction_id;
    transaction_02.start_time = transaction.start_time;
    bVar8 = CreateEntryInternal(this,transaction_02,local_c8,
                                (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                                 *)&local_90,local_98,true);
    if (local_90._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_90._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
    if (local_d8._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_d8._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
  }
  else {
    bVar8 = false;
  }
  if (local_d0._M_head_impl != (InCatalogEntry *)0x0) {
    (*((local_d0._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
  }
  return bVar8;
}

Assistant:

bool CatalogSet::RenameEntryInternal(CatalogTransaction transaction, CatalogEntry &old, const string &new_name,
                                     AlterInfo &alter_info, unique_lock<mutex> &read_lock) {
	auto &original_name = old.name;

	auto &context = *transaction.context;
	auto entry_value = map.GetEntry(new_name);
	if (entry_value) {
		auto &existing_entry = GetEntryForTransaction(transaction, *entry_value);
		if (!existing_entry.deleted) {
			// There exists an entry by this name that is not deleted
			old.UndoAlter(context, alter_info);
			throw CatalogException("Could not rename \"%s\" to \"%s\": another entry with this name already exists!",
			                       original_name, new_name);
		}
	}

	// Add a RENAMED_ENTRY before adding a DELETED_ENTRY, this makes it so that when this is committed
	// we know that this was not a DROP statement.
	auto renamed_tombstone = make_uniq<InCatalogEntry>(CatalogType::RENAMED_ENTRY, old.ParentCatalog(), original_name);
	renamed_tombstone->timestamp = transaction.transaction_id;
	renamed_tombstone->deleted = false;
	renamed_tombstone->set = this;
	if (!CreateEntryInternal(transaction, original_name, std::move(renamed_tombstone), read_lock,
	                         /*should_be_empty = */ false)) {
		return false;
	}
	if (!DropEntryInternal(transaction, original_name, false)) {
		return false;
	}

	// Add the renamed entry
	// Start this off with a RENAMED_ENTRY node, for commit/cleanup/rollback purposes
	auto renamed_node = make_uniq<InCatalogEntry>(CatalogType::RENAMED_ENTRY, catalog, new_name);
	renamed_node->timestamp = transaction.transaction_id;
	renamed_node->deleted = false;
	renamed_node->set = this;
	return CreateEntryInternal(transaction, new_name, std::move(renamed_node), read_lock);
}